

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_class.h
# Opt level: O2

uint small_class_calc_size_by_offset(small_class *sc,uint cls)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  
  uVar3 = cls + 1;
  uVar1 = sc->effective_mask & uVar3;
  bVar2 = (byte)sc->effective_bits & 0x1f;
  if (uVar3 >> bVar2 == 0) {
    bVar2 = (byte)(0 >> bVar2);
  }
  else {
    bVar2 = (char)(uVar3 >> bVar2) - 1;
    uVar1 = uVar1 | sc->effective_size;
  }
  return ((uVar1 << (bVar2 & 0x1f)) << ((byte)sc->ignore_bits_count & 0x1f)) + sc->size_shift;
}

Assistant:

static inline unsigned
small_class_calc_size_by_offset(struct small_class *sc, unsigned cls)
{
	++cls;
	/* Effective bits (without leading 1) in size */
	unsigned linear_part = cls & sc->effective_mask;
	/* Log2 base part of the size, maybe with leading 1 of the size. */
	unsigned log2 = cls >> sc->effective_bits;
	if (log2 != 0) {
		/* Remove leading 1 from log2 part and add to linear part. */
		log2--;
		linear_part |= sc->effective_size;
	}
	/* Reassemble size and add never significant bits. */
	return sc->size_shift + (linear_part << log2 << sc->ignore_bits_count);
}